

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_distribution(Integer g_a,Integer proc,Integer *lo,Integer *hi)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  long lVar7;
  C_Integer CVar8;
  int iVar9;
  C_Integer CVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int _ndim;
  uint uVar14;
  int _ndim_1;
  long lVar15;
  long lVar16;
  char err_string [256];
  int local_138 [66];
  
  lVar15 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar15)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_distribution");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar15].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_distribution");
    pnga_error((char *)local_138,g_a);
  }
  CVar10 = proc;
  if (0 < GA[lVar15].num_rstrctd) {
    CVar10 = GA[lVar15].rank_rstrctd[proc];
  }
  if (GA[lVar15].property == 1) {
    IVar6 = pnga_cluster_proc_nodeid(proc);
    IVar6 = pnga_cluster_nprocs(IVar6);
    CVar10 = proc % IVar6;
  }
  pgVar5 = GA;
  pgVar1 = GA + lVar15;
  iVar9 = GA[lVar15].distr_type;
  if (iVar9 - 1U < 3) {
    sVar2 = pgVar1->ndim;
    uVar14 = (uint)sVar2;
    uVar11 = (long)(int)CVar10 % pgVar1->num_blocks[0];
    local_138[0] = (int)uVar11;
    if (1 < (int)uVar14) {
      uVar11 = uVar11 & 0xffffffff;
      lVar15 = 0;
      do {
        CVar10 = (long)((int)CVar10 - (int)uVar11) / GA[g_a + 1000].num_blocks[lVar15];
        uVar11 = (long)(int)CVar10 % GA[g_a + 1000].num_blocks[lVar15 + 1];
        local_138[lVar15 + 1] = (int)uVar11;
        lVar15 = lVar15 + 1;
      } while ((ulong)uVar14 - 1 != lVar15);
    }
    if (0 < sVar2) {
      lVar15 = 0;
      do {
        pgVar1 = GA;
        iVar9 = *(int *)((long)local_138 + lVar15);
        *(long *)((long)lo + lVar15 * 2) =
             *(long *)((long)GA[g_a + 1000].block_dims + lVar15 * 2) * (long)iVar9 + 1;
        lVar12 = ((long)iVar9 + 1) * *(long *)((long)pgVar1[g_a + 1000].block_dims + lVar15 * 2);
        *(long *)((long)hi + lVar15 * 2) = lVar12;
        lVar7 = *(long *)((long)pgVar1[g_a + 1000].dims + lVar15 * 2);
        if (lVar7 <= lVar12) {
          lVar12 = lVar7;
        }
        *(long *)((long)hi + lVar15 * 2) = lVar12;
        lVar15 = lVar15 + 4;
      } while ((ulong)uVar14 << 2 != lVar15);
    }
  }
  else if (iVar9 == 4) {
    sVar2 = pgVar1->ndim;
    uVar14 = (uint)sVar2;
    uVar11 = (long)(int)CVar10 % pgVar1->num_blocks[0];
    local_138[0] = (int)uVar11;
    if (1 < (int)uVar14) {
      uVar11 = uVar11 & 0xffffffff;
      lVar7 = 0;
      do {
        CVar10 = (long)((int)CVar10 - (int)uVar11) / GA[g_a + 1000].num_blocks[lVar7];
        uVar11 = (long)(int)CVar10 % GA[g_a + 1000].num_blocks[lVar7 + 1];
        local_138[lVar7 + 1] = (int)uVar11;
        lVar7 = lVar7 + 1;
      } while ((ulong)uVar14 - 1 != lVar7);
    }
    if (0 < sVar2) {
      pCVar4 = GA[lVar15].mapc;
      lVar15 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)((long)local_138 + lVar15);
        lVar7 = (long)iVar9 + (long)iVar3;
        *(C_Integer *)((long)lo + lVar15 * 2) = pCVar4[lVar7];
        if ((long)iVar3 < *(long *)((long)pgVar1->num_blocks + lVar15 * 2) + -1) {
          lVar7 = pgVar1->mapc[lVar7 + 1] + -1;
        }
        else {
          lVar7 = *(long *)((long)pgVar1->dims + lVar15 * 2);
        }
        *(long *)((long)hi + lVar15 * 2) = lVar7;
        iVar9 = iVar9 + *(int *)((long)pgVar1->num_blocks + lVar15 * 2);
        lVar15 = lVar15 + 4;
      } while ((ulong)uVar14 << 2 != lVar15);
    }
  }
  else if (iVar9 == 0) {
    if (pgVar1->num_rstrctd == 0) {
      sVar2 = pgVar1->ndim;
      lVar15 = (long)sVar2;
      if (lVar15 < 1) {
        lVar7 = 1;
      }
      else {
        lVar7 = 1;
        lVar12 = 0;
        do {
          lVar7 = lVar7 * GA[g_a + 1000].nblock[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar15 != lVar12);
      }
      if ((CVar10 < 0) || (lVar7 <= CVar10)) {
        if (0 < sVar2) {
          lVar7 = 0;
          do {
            lo[lVar7] = 0;
            hi[lVar7] = -1;
            lVar7 = lVar7 + 1;
          } while (lVar15 != lVar7);
        }
      }
      else if (0 < sVar2) {
        pCVar4 = pgVar1->mapc;
        lVar7 = 0;
        lVar12 = 0;
        do {
          lVar16 = (long)pgVar5[g_a + 1000].nblock[lVar7];
          lVar13 = CVar10 % lVar16;
          lo[lVar7] = pCVar4[lVar13 + lVar12];
          if (lVar13 == lVar16 + -1) {
            CVar8 = pgVar5[g_a + 1000].dims[lVar7];
          }
          else {
            CVar8 = pCVar4[lVar13 + lVar12 + 1] + -1;
          }
          lVar12 = lVar12 + lVar16;
          hi[lVar7] = CVar8;
          lVar7 = lVar7 + 1;
          CVar10 = CVar10 / lVar16;
        } while (lVar15 != lVar7);
      }
    }
    else {
      sVar2 = pgVar1->ndim;
      lVar15 = (long)sVar2;
      if (CVar10 < pgVar1->num_rstrctd) {
        if (sVar2 < 1) {
          lVar7 = 1;
        }
        else {
          lVar7 = 1;
          lVar12 = 0;
          do {
            lVar7 = lVar7 * GA[g_a + 1000].nblock[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar15 != lVar12);
        }
        if ((CVar10 < 0) || (lVar7 <= CVar10)) {
          if (0 < sVar2) {
            lVar7 = 0;
            do {
              lo[lVar7] = 0;
              hi[lVar7] = -1;
              lVar7 = lVar7 + 1;
            } while (lVar15 != lVar7);
          }
        }
        else if (0 < sVar2) {
          pCVar4 = pgVar1->mapc;
          lVar7 = 0;
          lVar12 = 0;
          do {
            lVar16 = (long)pgVar5[g_a + 1000].nblock[lVar12];
            lVar13 = CVar10 % lVar16;
            lo[lVar12] = pCVar4[lVar13 + lVar7];
            if (lVar13 == lVar16 + -1) {
              CVar8 = pgVar5[g_a + 1000].dims[lVar12];
            }
            else {
              CVar8 = pCVar4[lVar13 + lVar7 + 1] + -1;
            }
            lVar7 = lVar7 + lVar16;
            hi[lVar12] = CVar8;
            lVar12 = lVar12 + 1;
            CVar10 = CVar10 / lVar16;
          } while (lVar15 != lVar12);
        }
      }
      else if (0 < sVar2) {
        lVar7 = 0;
        do {
          lo[lVar7] = 0;
          hi[lVar7] = -1;
          lVar7 = lVar7 + 1;
        } while (lVar15 != lVar7);
      }
    }
  }
  return;
}

Assistant:

void pnga_distribution(Integer g_a, Integer proc, Integer *lo, Integer * hi)
{
  Integer ga_handle, lproc, old_grp;

  ga_check_handleM(g_a, "nga_distribution");
  ga_handle = (GA_OFFSET + g_a);

  lproc = proc;
  if (GA[ga_handle].num_rstrctd > 0) {
    lproc = GA[ga_handle].rank_rstrctd[lproc];
  }
  /* This currently assumes that read-only property can only be applied to
   * processors on the world group */
  if (GA[ga_handle].property == READ_ONLY) {
    Integer node = pnga_cluster_proc_nodeid(proc);
    Integer nodesize = pnga_cluster_nprocs(node);
    lproc = proc%nodesize;
  }
  ga_ownsM(ga_handle, lproc, lo, hi);
}